

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O0

block dpf_seed(block *seed)

{
  int iVar1;
  longlong lVar2;
  undefined4 extraout_var_00;
  AES_KEY *in_RDX;
  AES_KEY *extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong lVar3;
  int in_ESI;
  block alVar4;
  longlong lStack_48;
  block cur_seed;
  block *seed_local;
  undefined4 extraout_var;
  
  current_rand_index = 0;
  if (seed == (block *)0x0) {
    in_ESI = 0x10;
    iVar1 = RAND_bytes((uchar *)&lStack_48,0x10);
    in_RDX = extraout_RDX;
    if (iVar1 == 0) {
      iVar1 = fprintf(_stderr,"** unable to seed securely\n");
      lVar2 = CONCAT44(extraout_var,iVar1);
      lVar3 = extraout_RDX_00;
      goto LAB_00103f78;
    }
  }
  else {
    lStack_48 = (*seed)[0];
    cur_seed[0] = (*seed)[1];
  }
  iVar1 = AES_set_encrypt_key((uchar *)&rand_aes_key,in_ESI,in_RDX);
  lVar2 = CONCAT44(extraout_var_00,iVar1);
  lVar3 = extraout_RDX_01;
LAB_00103f78:
  alVar4[1] = lVar3;
  alVar4[0] = lVar2;
  return alVar4;
}

Assistant:

block
dpf_seed(block *seed)
{
    block cur_seed;
    current_rand_index = 0;
    if (seed) {
        cur_seed = *seed;
    } else {
        if (RAND_bytes((unsigned char *) &cur_seed, 16) == 0) {
            fprintf(stderr, "** unable to seed securely\n");
            return dpf_zero_block();
        }
    }
    AES_set_encrypt_key(cur_seed, &rand_aes_key);
    return cur_seed;
}